

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagesetupdialog_unix.cpp
# Opt level: O2

void __thiscall QPageSetupDialog::QPageSetupDialog(QPageSetupDialog *this,QWidget *parent)

{
  QUnixPageSetupDialogPrivate *pQVar1;
  QArrayDataPointer<char16_t> *ctx;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  ctx = &QStack_38;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QUnixPageSetupDialogPrivate *)operator_new(800);
  QUnixPageSetupDialogPrivate::QUnixPageSetupDialogPrivate(pQVar1,(QPrinter *)0x0);
  QDialog::QDialog((QDialog *)this,pQVar1,parent,0);
  *(undefined ***)this = &PTR_metaObject_00165e18;
  *(undefined ***)(this + 0x10) = &PTR__QPageSetupDialog_00165ff0;
  pQVar1 = *(QUnixPageSetupDialogPrivate **)(this + 8);
  QCoreApplication::translate((char *)&QStack_38,"QPrintPreviewDialog","Page Setup",0);
  QWidget::setWindowTitle((QString *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
  QUnixPageSetupDialogPrivate::init(pQVar1,(EVP_PKEY_CTX *)ctx);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QPageSetupDialog::QPageSetupDialog(QWidget *parent)
    : QDialog(*(new QUnixPageSetupDialogPrivate(nullptr)), parent)
{
    Q_D(QPageSetupDialog);
    setWindowTitle(QCoreApplication::translate("QPrintPreviewDialog", "Page Setup"));
    static_cast<QUnixPageSetupDialogPrivate *>(d)->init();
}